

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt32Size(RepeatedField<int> *value)

{
  int *piVar1;
  size_t sVar2;
  int index;
  size_t sVar3;
  int iVar4;
  
  sVar3 = 0;
  iVar4 = value->current_size_;
  if (value->current_size_ < 1) {
    iVar4 = 0;
  }
  for (index = 0; iVar4 != index; index = index + 1) {
    piVar1 = RepeatedField<int>::Get(value,index);
    sVar2 = SInt32Size(*piVar1);
    sVar3 = sVar3 + sVar2;
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::SInt32Size(const RepeatedField<int32>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += SInt32Size(value.Get(i));
  }
  return out;
}